

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
     ::match(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
             candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
            *matchers)

{
  BinaryOp BVar1;
  matched_t<wasm::Const_*> pCVar2;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *pMVar3;
  matched_t<wasm::Const_*> *ppCVar4;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> pBVar5;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *pMVar6;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar7;
  bool bVar8;
  BinaryOp BVar9;
  Literal local_40;
  
  pCVar2 = (matched_t<wasm::Const_*>)candidate->left;
  if ((pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)
  {
    pMVar3 = matchers->curr;
    ppCVar4 = pMVar3->binder;
    if (ppCVar4 != (matched_t<wasm::Const_*> *)0x0) {
      *ppCVar4 = pCVar2;
    }
    Literal::Literal(&local_40,&pCVar2->value);
    bVar8 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(&(pMVar3->submatchers).curr,&local_40);
    Literal::~Literal(&local_40);
    if ((bVar8) &&
       (pBVar5 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                  )candidate->right,
       (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId
       )) {
      pMVar6 = (matchers->next).curr;
      if (pMVar6->binder !=
          (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
           *)0x0) {
        *pMVar6->binder = pBVar5;
      }
      BVar1 = pBVar5->op;
      BVar9 = Abstract::getBinary((Type)(pBVar5->left->type).id,pMVar6->data);
      if ((BVar1 == BVar9) &&
         (pCVar2 = (matched_t<wasm::Const_*>)pBVar5->left,
         (pCVar2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
         ConstId)) {
        pMVar3 = (pMVar6->submatchers).curr;
        ppCVar4 = pMVar3->binder;
        if (ppCVar4 != (matched_t<wasm::Const_*> *)0x0) {
          *ppCVar4 = pCVar2;
        }
        Literal::Literal(&local_40,&pCVar2->value);
        bVar8 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                ::matches(&(pMVar3->submatchers).curr,&local_40);
        Literal::~Literal(&local_40);
        if (bVar8) {
          ppEVar7 = ((pMVar6->submatchers).next.curr)->binder;
          if (ppEVar7 == (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
            return true;
          }
          *ppEVar7 = pBVar5->right;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }